

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

vector * __thiscall lsh::vector::to_string_abi_cxx11_(vector *this)

{
  uint uVar1;
  bool bVar2;
  vector *in_RSI;
  __cxx11 local_78 [32];
  uint local_58;
  uint i;
  allocator local_41;
  string local_40 [8];
  string value;
  uint n;
  vector *this_local;
  
  uVar1 = in_RSI->size_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Vector[",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  for (local_58 = 0; local_58 < uVar1; local_58 = local_58 + 1) {
    bVar2 = get(in_RSI,local_58);
    std::__cxx11::to_string(local_78,(uint)bVar2);
    std::__cxx11::string::operator+=(local_40,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_40);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

std::string vector::to_string() const {
    unsigned int n = this->size_;

    std::string value = "Vector[";

    for (unsigned int i = 0; i < n; i++) {
      value += std::to_string(this->get(i));
    }

    return value + "]";
  }